

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D::forward
          (DeformableConv2D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  pointer pMVar17;
  pointer pMVar18;
  Mat *this_00;
  void *pvVar19;
  float *pfVar20;
  size_t sVar21;
  size_t sVar22;
  void *pvVar23;
  pointer pMVar24;
  void *pvVar25;
  bool bVar26;
  int iVar27;
  bool bVar28;
  int iVar29;
  long lVar30;
  bool bVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  uint _h;
  int iVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  bool bVar39;
  uint _w;
  long lVar40;
  uint uVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  bool bVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  int h_in;
  int local_1a0;
  ulong local_190;
  ulong local_188;
  void *local_118;
  
  pMVar17 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar18 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar1 = pMVar17->w;
  iVar2 = pMVar17->h;
  uVar3 = pMVar17->c;
  iVar29 = (~((this->kernel_w + -1) * this->dilation_w) + iVar1 + this->pad_left + this->pad_right)
           / this->stride_w;
  _w = iVar29 + 1;
  iVar27 = (~((this->kernel_h + -1) * this->dilation_h) + iVar2 + this->pad_top + this->pad_bottom)
           / this->stride_h;
  _h = iVar27 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,_w,_h,this->num_output,pMVar17->elemsize,opt->blob_allocator);
  iVar32 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pvVar19 = (this->weight_data).data;
    local_118 = pvVar19;
    if (this->bias_term != 0) {
      local_118 = (this->bias_data).data;
    }
    if (-1 < iVar27) {
      iVar27 = this->stride_h;
      iVar32 = this->pad_top;
      iVar4 = this->num_output;
      iVar5 = this->stride_w;
      iVar6 = this->pad_left;
      local_190 = 0;
      do {
        if (-1 < iVar29) {
          iVar7 = this->kernel_h;
          iVar8 = this->bias_term;
          iVar9 = this->activation_type;
          iVar10 = this->num_output;
          local_188 = 0;
          do {
            if (0 < iVar4) {
              iVar11 = this->kernel_w;
              iVar12 = this->kernel_h;
              pfVar20 = (float *)(this->activation_params).data;
              iVar13 = this_00->w;
              sVar21 = this_00->elemsize;
              sVar22 = this_00->cstep;
              pvVar23 = this_00->data;
              iVar48 = 0;
              lVar49 = 0;
              do {
                if (iVar8 == 0) {
                  fVar61 = 0.0;
                }
                else {
                  fVar61 = *(float *)((long)local_118 + lVar49 * 4);
                }
                if (0 < iVar7) {
                  iVar14 = this->kernel_w;
                  iVar15 = this->dilation_w;
                  pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  iVar16 = this->dilation_h;
                  iVar33 = this->kernel_h * iVar14;
                  iVar35 = iVar33 * iVar48;
                  local_1a0 = 0;
                  do {
                    if (0 < iVar11) {
                      lVar40 = pMVar17[1].cstep * pMVar17[1].elemsize;
                      pvVar25 = pMVar17[1].data;
                      lVar30 = local_188 * 4 + (long)pMVar17[1].w * local_190 * pMVar17[1].elemsize;
                      iVar44 = 0;
                      iVar36 = iVar35;
                      iVar47 = iVar11;
                      do {
                        iVar34 = iVar14 * local_1a0 + iVar44;
                        fVar62 = 1.0;
                        if ((long)pMVar18 - (long)pMVar17 == 0xd8) {
                          fVar62 = *(float *)((long)pMVar24[2].data +
                                             local_188 * 4 +
                                             (long)pMVar24[2].w * local_190 * pMVar24[2].elemsize +
                                             (long)iVar34 * pMVar24[2].cstep * pMVar24[2].elemsize);
                        }
                        fVar55 = *(float *)((long)pvVar25 +
                                           ((iVar47 * local_1a0 + iVar44) * 2) * lVar40 + lVar30) +
                                 (float)(iVar16 * local_1a0 + (iVar27 * (int)local_190 - iVar32));
                        fVar56 = (float)(iVar15 * iVar44 + (iVar5 * (int)local_188 - iVar6)) +
                                 *(float *)((long)pvVar25 + (iVar34 * 2 + 1) * lVar40 + lVar30);
                        if ((float)iVar1 <= fVar56 ||
                            (((float)iVar2 <= fVar55 || fVar56 <= -1.0) || fVar55 <= -1.0)) {
                          fVar51 = 0.0;
                          fVar52 = 0.0;
                          fVar54 = 0.0;
                          fVar53 = 0.0;
                          lVar42 = 0;
                          lVar43 = 0;
                          lVar46 = 0;
                          lVar45 = 0;
                          bVar50 = false;
                          bVar31 = false;
                          bVar28 = false;
                          bVar39 = false;
                        }
                        else {
                          fVar51 = floorf(fVar55);
                          uVar37 = (uint)fVar51;
                          fVar52 = floorf(fVar56);
                          uVar41 = (uint)fVar52;
                          fVar57 = fVar55 - (float)(int)fVar51;
                          fVar53 = fVar56 - (float)(int)uVar41;
                          bVar50 = -1 < (int)(uVar37 | uVar41);
                          bVar26 = (int)uVar41 < iVar1 + -1;
                          bVar31 = -1 < (int)uVar37 && bVar26;
                          bVar39 = (int)uVar37 < iVar2 + -1;
                          bVar28 = -1 < (int)uVar41 && bVar39;
                          bVar39 = bVar39 && bVar26;
                          fVar51 = (1.0 - fVar53) * fVar57;
                          fVar52 = fVar57 * fVar53;
                          fVar54 = fVar53 * (1.0 - fVar57);
                          fVar53 = (1.0 - fVar57) * (1.0 - fVar53);
                          lVar43 = (long)(int)uVar41;
                          lVar45 = (long)(int)(uVar41 + 1);
                          lVar42 = (long)(int)uVar37;
                          lVar46 = (long)(int)(uVar37 + 1);
                        }
                        if (0 < (int)uVar3) {
                          uVar38 = 0;
                          iVar47 = iVar36;
                          do {
                            fVar57 = 0.0;
                            if ((float)iVar1 > fVar56 &&
                                (((float)iVar2 > fVar55 && fVar56 > -1.0) && fVar55 > -1.0)) {
                              fVar58 = 0.0;
                              if (bVar50) {
                                fVar58 = *(float *)((long)pMVar17->data +
                                                   lVar43 * 4 +
                                                   pMVar17->w * lVar42 * pMVar17->elemsize +
                                                   pMVar17->cstep * uVar38 * pMVar17->elemsize);
                              }
                              if (bVar31) {
                                fVar57 = *(float *)((long)pMVar17->data +
                                                   lVar45 * 4 +
                                                   pMVar17->w * lVar42 * pMVar17->elemsize +
                                                   pMVar17->cstep * uVar38 * pMVar17->elemsize);
                              }
                              fVar60 = 0.0;
                              fVar59 = 0.0;
                              if (bVar28) {
                                fVar59 = *(float *)((long)pMVar17->data +
                                                   lVar43 * 4 +
                                                   pMVar17->w * lVar46 * pMVar17->elemsize +
                                                   pMVar17->cstep * uVar38 * pMVar17->elemsize);
                              }
                              if (bVar39) {
                                fVar60 = *(float *)((long)pMVar17->data +
                                                   lVar45 * 4 +
                                                   pMVar17->w * lVar46 * pMVar17->elemsize +
                                                   pMVar17->cstep * uVar38 * pMVar17->elemsize);
                              }
                              fVar57 = fVar58 * fVar53 + fVar60 * fVar52 +
                                       fVar57 * fVar54 + fVar59 * fVar51;
                            }
                            fVar61 = fVar61 + fVar57 * fVar62 *
                                              *(float *)((long)pvVar19 + (long)iVar47 * 4);
                            uVar38 = uVar38 + 1;
                            iVar47 = iVar47 + iVar33;
                          } while (uVar3 != uVar38);
                        }
                        iVar44 = iVar44 + 1;
                        iVar36 = iVar36 + 1;
                        iVar47 = iVar14;
                      } while (iVar44 < iVar14);
                    }
                    local_1a0 = local_1a0 + 1;
                    iVar35 = iVar35 + iVar14;
                  } while (local_1a0 < iVar12);
                }
                fVar62 = fVar61;
                switch(iVar9) {
                case 1:
                  if (fVar61 <= 0.0) {
                    fVar62 = 0.0;
                  }
                  break;
                case 2:
                  fVar62 = (float)(~-(uint)(0.0 < fVar61) & (uint)*pfVar20 |
                                  -(uint)(0.0 < fVar61) & 0x3f800000) * fVar61;
                  break;
                case 3:
                  if (fVar61 <= *pfVar20) {
                    fVar61 = *pfVar20;
                  }
                  fVar62 = pfVar20[1];
                  if (fVar61 <= pfVar20[1]) {
                    fVar62 = fVar61;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar61) {
                    fVar61 = 88.37626;
                  }
                  fVar61 = expf((float)(-(uint)(fVar61 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar61 < -88.37626) & (uint)-fVar61));
                  fVar62 = 1.0 / (fVar61 + 1.0);
                  break;
                case 5:
                  fVar62 = expf(fVar61);
                  fVar62 = logf(fVar62 + 1.0);
                  fVar62 = tanhf(fVar62);
                  fVar62 = fVar62 * fVar61;
                  break;
                case 6:
                  fVar55 = *pfVar20;
                  fVar56 = -pfVar20[1] / fVar55;
                  fVar62 = 0.0;
                  if ((fVar56 <= fVar61) && (fVar62 = fVar61, fVar61 <= fVar56 + 1.0 / fVar55)) {
                    fVar62 = (fVar55 * fVar61 + pfVar20[1]) * fVar61;
                  }
                }
                *(float *)((long)pvVar23 +
                          sVar22 * sVar21 * lVar49 +
                          local_188 * 4 + (long)iVar13 * local_190 * sVar21) = fVar62;
                lVar49 = lVar49 + 1;
                iVar48 = iVar48 + uVar3;
              } while (lVar49 < iVar10);
            }
            local_188 = local_188 + 1;
          } while (local_188 != _w);
        }
        local_190 = local_190 + 1;
      } while (local_190 != _h);
    }
    iVar32 = 0;
  }
  return iVar32;
}

Assistant:

int DeformableConv2D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output.shape is [num_output, out_h, out_w] (in python).
    Mat& output = top_blobs[0];
    output.create(out_w, out_h, num_output, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    const float* weight_ptr = weight_data;
    const float* bias_ptr = weight_data;
    if (bias_term)
        bias_ptr = bias_data;

    // deformable conv
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            for (int oc = 0; oc < num_output; oc++)
            {
                float sum = 0.f;
                if (bias_term)
                    sum = bias_ptr[oc];
                for (int i = 0; i < kernel_h; i++)
                {
                    for (int j = 0; j < kernel_w; j++)
                    {
                        const float offset_h = offset.channel((i * kernel_w + j) * 2).row(h_col)[w_col];
                        const float offset_w = offset.channel((i * kernel_w + j) * 2 + 1).row(h_col)[w_col];
                        const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                        const float h_im = h_in + i * dilation_h + offset_h;
                        const float w_im = w_in + j * dilation_w + offset_w;

                        // Bilinear
                        const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                        int h_low = 0;
                        int w_low = 0;
                        int h_high = 0;
                        int w_high = 0;
                        float w1 = 0.f;
                        float w2 = 0.f;
                        float w3 = 0.f;
                        float w4 = 0.f;
                        bool v1_cond = false;
                        bool v2_cond = false;
                        bool v3_cond = false;
                        bool v4_cond = false;
                        if (cond)
                        {
                            h_low = (int)floorf(h_im);
                            w_low = (int)floorf(w_im);
                            h_high = h_low + 1;
                            w_high = w_low + 1;

                            float lh = h_im - h_low;
                            float lw = w_im - w_low;
                            float hh = 1 - lh;
                            float hw = 1 - lw;

                            v1_cond = (h_low >= 0 && w_low >= 0);
                            v2_cond = (h_low >= 0 && w_high <= w - 1);
                            v3_cond = (h_high <= h - 1 && w_low >= 0);
                            v4_cond = (h_high <= h - 1 && w_high <= w - 1);

                            w1 = hh * hw;
                            w2 = hh * lw;
                            w3 = lh * hw;
                            w4 = lh * lw;
                        }

                        for (int c_im = 0; c_im < in_c; c_im++)
                        {
                            float val = 0.f;
                            if (cond)
                            {
                                float v1 = v1_cond ? bottom_blob.channel(c_im).row(h_low)[w_low] : 0.f;
                                float v2 = v2_cond ? bottom_blob.channel(c_im).row(h_low)[w_high] : 0.f;
                                float v3 = v3_cond ? bottom_blob.channel(c_im).row(h_high)[w_low] : 0.f;
                                float v4 = v4_cond ? bottom_blob.channel(c_im).row(h_high)[w_high] : 0.f;
                                val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                            }
                            sum += val * mask_ * weight_ptr[((oc * in_c + c_im) * kernel_h + i) * kernel_w + j];
                        }
                    }
                }
                output.channel(oc).row(h_col)[w_col] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    return 0;
}